

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::
TestFactoryImpl<google::protobuf::(anonymous_namespace)::NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroEnum_Test<absl::lts_20250127::Cord>_>
::CreateTest(TestFactoryImpl<google::protobuf::(anonymous_namespace)::NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroEnum_Test<absl::lts_20250127::Cord>_>
             *this)

{
  NoFieldPresenceMapSerializeTest<absl::lts_20250127::Cord> *this_00;
  
  this_00 = (NoFieldPresenceMapSerializeTest<absl::lts_20250127::Cord> *)operator_new(0x20);
  google::protobuf::anon_unknown_0::NoFieldPresenceMapSerializeTest<absl::lts_20250127::Cord>::
  NoFieldPresenceMapSerializeTest(this_00);
  (this_00->super_Test)._vptr_Test = (_func_int **)&PTR__NoFieldPresenceMapSerializeTest_0162bc18;
  return &this_00->super_Test;
}

Assistant:

Test* CreateTest() override { return new TestClass; }